

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O3

void __thiscall serialization::xml_iarchive::unserialize_start(xml_iarchive *this)

{
  iterator *piVar1;
  _Elt_pointer ppxVar2;
  undefined8 *puVar3;
  xml_node<char> *node;
  _Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  local_68;
  
  local_68._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  _M_initialize_map(&local_68,0);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  _M_move_assign1(&(this->stack_).c,&local_68);
  std::
  _Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  ~_Deque_base(&local_68);
  local_68._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       rapidxml::xml_node<char>::first_node((xml_node<char> *)this,"serialization",0,true);
  if ((xml_node<char> *)local_68._M_impl.super__Deque_impl_data._M_map != (xml_node<char> *)0x0) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppxVar2 ==
        (this->stack_).c.
        super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>::
      _M_push_back_aux<rapidxml::xml_node<char>const*const&>
                ((deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
                  *)&this->stack_,(xml_node<char> **)&local_68);
    }
    else {
      *ppxVar2 = (xml_node<char> *)local_68._M_impl.super__Deque_impl_data._M_map;
      piVar1 = &(this->stack_).c.
                super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar3 = &PTR__exception_00120d50;
  puVar3[1] = "xml";
  puVar3[2] = "serilization root";
  __cxa_throw(puVar3,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

void unserialize_start() const
    {
        serialization_trace trace(__func__, "xml");
        stack_ = std::stack<const rapidxml::xml_node<> *> {};
        auto node = document_.first_node("serialization");
        if(node == nullptr)
            throw_serialization_error("serilization root", "xml");
        stack_.push(node);
    }